

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

ArgList * __thiscall
CompilerContext::get_args
          (ArgList *__return_storage_ptr__,CompilerContext *this,Command *command,
          vector<linb::any,_std::allocator<linb::any>_> *params)

{
  bool bVar1;
  size_type __n;
  ArgVariant local_98;
  reference local_60;
  any *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<linb::any,_std::allocator<linb::any>_> *__range1;
  vector<linb::any,_std::allocator<linb::any>_> *params_local;
  Command *command_local;
  CompilerContext *this_local;
  ArgList *args;
  
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(__return_storage_ptr__);
  __n = std::vector<linb::any,_std::allocator<linb::any>_>::size(params);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::reserve(__return_storage_ptr__,__n);
  __end1 = std::vector<linb::any,_std::allocator<linb::any>_>::begin(params);
  p = (any *)std::vector<linb::any,_std::allocator<linb::any>_>::end(params);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_linb::any_*,_std::vector<linb::any,_std::allocator<linb::any>_>_>
                                     *)&p), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_linb::any_*,_std::vector<linb::any,_std::allocator<linb::any>_>_>
               ::operator*(&__end1);
    get_arg(&local_98,this,local_60);
    std::
    vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
    ::
    emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
              ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                *)__return_storage_ptr__,&local_98);
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(&local_98);
    __gnu_cxx::
    __normal_iterator<const_linb::any_*,_std::vector<linb::any,_std::allocator<linb::any>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto CompilerContext::get_args(const Command& command, const std::vector<any>& params) -> ArgList
{
    ArgList args;
    args.reserve(params.size());

    for(auto& p : params)
        args.emplace_back(get_arg(p));

    return args;
}